

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_DsdPerform_rec(word t,char *pBuffer,int Pos,int *pVars,int nVars)

{
  int iVar1;
  word wVar2;
  int local_104;
  int local_100;
  int CountCur;
  int CountBest;
  int vBest;
  int u;
  int v;
  int PosStart;
  int nVarsNew;
  int pVarsNew [6];
  word Cof [4];
  word Cof1 [6];
  word Cof0 [6];
  char local_3e [8];
  char pNest [10];
  int nVars_local;
  int *pVars_local;
  int Pos_local;
  char *pBuffer_local;
  word t_local;
  
  stack0xffffffffffffffd0 = pVars;
  pNest._2_4_ = nVars;
  if (1999 < Pos) {
    __assert_fail("Pos < DAU_MAX_STR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dau/dauDsd.c"
                  ,0x2a7,"int Dau_DsdPerform_rec(word, char *, int, int *, int)");
  }
  v = 0;
  for (vBest = 0; vBest < (int)pNest._2_4_; vBest = vBest + 1) {
    iVar1 = Abc_Tt6HasVar(t,stack0xffffffffffffffd0[vBest]);
    if (iVar1 != 0) {
      (&PosStart)[v] = stack0xffffffffffffffd0[vBest];
      v = v + 1;
    }
  }
  if (v < 1) {
    __assert_fail("nVarsNew > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dau/dauDsd.c"
                  ,0x2ad,"int Dau_DsdPerform_rec(word, char *, int, int *, int)");
  }
  if (v == 1) {
    if (t == s_Truths6[PosStart]) {
      t_local._4_4_ = Pos + 1;
      pBuffer[Pos] = (char)PosStart + 'a';
    }
    else {
      if (t != (s_Truths6[PosStart] ^ 0xffffffffffffffff)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dau/dauDsd.c"
                      ,700,"int Dau_DsdPerform_rec(word, char *, int, int *, int)");
      }
      pBuffer[Pos] = '!';
      t_local._4_4_ = Pos + 2;
      pBuffer[Pos + 1] = (char)PosStart + 'a';
    }
  }
  else {
    for (vBest = 0; vBest < v; vBest = vBest + 1) {
      wVar2 = Abc_Tt6Cofactor0(t,(&PosStart)[vBest]);
      Cof1[(long)vBest + 5] = wVar2;
      wVar2 = Abc_Tt6Cofactor1(t,(&PosStart)[vBest]);
      Cof[(long)vBest + 3] = wVar2;
      if (Cof1[(long)vBest + 5] == Cof[(long)vBest + 3]) {
        __assert_fail("Cof0[v] != Cof1[v]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dau/dauDsd.c"
                      ,0x2c4,"int Dau_DsdPerform_rec(word, char *, int, int *, int)");
      }
      if (Cof1[(long)vBest + 5] == 0) {
        pBuffer[Pos] = '(';
        pBuffer[Pos + 1] = (char)(&PosStart)[vBest] + 'a';
        iVar1 = Dau_DsdPerform_rec(Cof[(long)vBest + 3],pBuffer,Pos + 2,&PosStart,v);
        pBuffer[iVar1] = ')';
        return iVar1 + 1;
      }
      if (Cof1[(long)vBest + 5] == 0xffffffffffffffff) {
        pBuffer[Pos] = '!';
        pBuffer[Pos + 1] = '(';
        pBuffer[Pos + 2] = (char)(&PosStart)[vBest] + 'a';
        iVar1 = Dau_DsdPerform_rec(Cof[(long)vBest + 3] ^ 0xffffffffffffffff,pBuffer,Pos + 3,
                                   &PosStart,v);
        pBuffer[iVar1] = ')';
        return iVar1 + 1;
      }
      if (Cof[(long)vBest + 3] == 0) {
        pBuffer[Pos] = '(';
        pBuffer[Pos + 1] = '!';
        pBuffer[Pos + 2] = (char)(&PosStart)[vBest] + 'a';
        iVar1 = Dau_DsdPerform_rec(Cof1[(long)vBest + 5],pBuffer,Pos + 3,&PosStart,v);
        pBuffer[iVar1] = ')';
        return iVar1 + 1;
      }
      if (Cof[(long)vBest + 3] == 0xffffffffffffffff) {
        pBuffer[Pos] = '!';
        pBuffer[Pos + 1] = '(';
        pBuffer[Pos + 2] = '!';
        pBuffer[Pos + 3] = (char)(&PosStart)[vBest] + 'a';
        iVar1 = Dau_DsdPerform_rec(Cof1[(long)vBest + 5] ^ 0xffffffffffffffff,pBuffer,Pos + 4,
                                   &PosStart,v);
        pBuffer[iVar1] = ')';
        return iVar1 + 1;
      }
      if (Cof1[(long)vBest + 5] == (Cof[(long)vBest + 3] ^ 0xffffffffffffffff)) {
        pBuffer[Pos] = '[';
        pBuffer[Pos + 1] = (char)(&PosStart)[vBest] + 'a';
        iVar1 = Dau_DsdPerform_rec(Cof1[(long)vBest + 5],pBuffer,Pos + 2,&PosStart,v);
        pBuffer[iVar1] = ']';
        return iVar1 + 1;
      }
    }
    for (vBest = 0; CountBest = vBest, vBest < v; vBest = vBest + 1) {
      while (CountBest = CountBest + 1, CountBest < v) {
        wVar2 = Abc_Tt6Cofactor0(Cof1[(long)vBest + 5],(&PosStart)[CountBest]);
        Cof[0] = Abc_Tt6Cofactor1(Cof1[(long)vBest + 5],(&PosStart)[CountBest]);
        Cof[1] = Abc_Tt6Cofactor0(Cof[(long)vBest + 3],(&PosStart)[CountBest]);
        Cof[2] = Abc_Tt6Cofactor1(Cof[(long)vBest + 3],(&PosStart)[CountBest]);
        if ((wVar2 == Cof[0]) && (wVar2 == Cof[1])) {
          sprintf(local_3e,"(%c%c)",(ulong)((&PosStart)[vBest] + 0x61),
                  (ulong)((&PosStart)[CountBest] + 0x61));
          iVar1 = Dau_DsdPerform_rec(s_Truths6[(&PosStart)[CountBest]] & Cof[2] |
                                     (s_Truths6[(&PosStart)[CountBest]] ^ 0xffffffffffffffff) &
                                     wVar2,pBuffer,Pos,&PosStart,v);
          iVar1 = Dau_DsdPerformReplace(pBuffer,Pos,iVar1,(&PosStart)[CountBest] + 0x61,local_3e);
          return iVar1;
        }
        if ((wVar2 == Cof[0]) && (wVar2 == Cof[2])) {
          sprintf(local_3e,"(%c!%c)",(ulong)((&PosStart)[vBest] + 0x61),
                  (ulong)((&PosStart)[CountBest] + 0x61));
          iVar1 = Dau_DsdPerform_rec(s_Truths6[(&PosStart)[CountBest]] & Cof[1] |
                                     (s_Truths6[(&PosStart)[CountBest]] ^ 0xffffffffffffffff) &
                                     wVar2,pBuffer,Pos,&PosStart,v);
          iVar1 = Dau_DsdPerformReplace(pBuffer,Pos,iVar1,(&PosStart)[CountBest] + 0x61,local_3e);
          return iVar1;
        }
        if ((wVar2 == Cof[1]) && (wVar2 == Cof[2])) {
          sprintf(local_3e,"(!%c%c)",(ulong)((&PosStart)[vBest] + 0x61),
                  (ulong)((&PosStart)[CountBest] + 0x61));
          iVar1 = Dau_DsdPerform_rec(s_Truths6[(&PosStart)[CountBest]] & Cof[0] |
                                     (s_Truths6[(&PosStart)[CountBest]] ^ 0xffffffffffffffff) &
                                     wVar2,pBuffer,Pos,&PosStart,v);
          iVar1 = Dau_DsdPerformReplace(pBuffer,Pos,iVar1,(&PosStart)[CountBest] + 0x61,local_3e);
          return iVar1;
        }
        if ((Cof[0] == Cof[1]) && (Cof[0] == Cof[2])) {
          sprintf(local_3e,"(!%c!%c)",(ulong)((&PosStart)[vBest] + 0x61),
                  (ulong)((&PosStart)[CountBest] + 0x61));
          iVar1 = Dau_DsdPerform_rec(s_Truths6[(&PosStart)[CountBest]] & wVar2 |
                                     (s_Truths6[(&PosStart)[CountBest]] ^ 0xffffffffffffffff) &
                                     Cof[0],pBuffer,Pos,&PosStart,v);
          iVar1 = Dau_DsdPerformReplace(pBuffer,Pos,iVar1,(&PosStart)[CountBest] + 0x61,local_3e);
          return iVar1;
        }
        if ((wVar2 == Cof[2]) && (Cof[0] == Cof[1])) {
          sprintf(local_3e,"[%c%c]",(ulong)((&PosStart)[vBest] + 0x61),
                  (ulong)((&PosStart)[CountBest] + 0x61));
          iVar1 = Dau_DsdPerform_rec(s_Truths6[(&PosStart)[CountBest]] & Cof[0] |
                                     (s_Truths6[(&PosStart)[CountBest]] ^ 0xffffffffffffffff) &
                                     wVar2,pBuffer,Pos,&PosStart,v);
          iVar1 = Dau_DsdPerformReplace(pBuffer,Pos,iVar1,(&PosStart)[CountBest] + 0x61,local_3e);
          return iVar1;
        }
      }
    }
    CountCur = -1;
    local_100 = 10;
    for (vBest = 0; vBest < v; vBest = vBest + 1) {
      local_104 = 0;
      for (CountBest = 0; CountBest < v; CountBest = CountBest + 1) {
        if (((CountBest != vBest) &&
            (iVar1 = Abc_Tt6HasVar(Cof1[(long)vBest + 5],(&PosStart)[CountBest]), iVar1 != 0)) &&
           (iVar1 = Abc_Tt6HasVar(Cof[(long)vBest + 3],(&PosStart)[CountBest]), iVar1 != 0)) {
          local_104 = local_104 + 1;
        }
      }
      if (local_104 < local_100) {
        local_100 = local_104;
        CountCur = vBest;
      }
      if (local_104 == 0) break;
    }
    pBuffer[Pos] = '<';
    pBuffer[Pos + 1] = (char)(&PosStart)[CountCur] + 'a';
    iVar1 = Dau_DsdPerform_rec(Cof[(long)CountCur + 3],pBuffer,Pos + 2,&PosStart,v);
    iVar1 = Dau_DsdPerform_rec(Cof1[(long)CountCur + 5],pBuffer,iVar1,&PosStart,v);
    t_local._4_4_ = iVar1 + 1;
    pBuffer[iVar1] = '>';
  }
  return t_local._4_4_;
}

Assistant:

int Dau_DsdPerform_rec( word t, char * pBuffer, int Pos, int * pVars, int nVars )
{
    char pNest[10];
    word Cof0[6], Cof1[6], Cof[4];
    int pVarsNew[6], nVarsNew, PosStart;
    int v, u, vBest, CountBest;
    assert( Pos < DAU_MAX_STR );
    // perform support minimization
    nVarsNew = 0;
    for ( v = 0; v < nVars; v++ )
        if ( Abc_Tt6HasVar( t, pVars[v] ) )
            pVarsNew[ nVarsNew++ ] = pVars[v];
    assert( nVarsNew > 0 );
    // special case when function is a var
    if ( nVarsNew == 1 )
    {
        if ( t == s_Truths6[ pVarsNew[0] ] )
        {
            pBuffer[Pos++] = 'a' +  pVarsNew[0];
            return Pos;
        }
        if ( t == ~s_Truths6[ pVarsNew[0] ] )
        {
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = 'a' +  pVarsNew[0];
            return Pos;
        }
        assert( 0 );
        return Pos;
    }
    // decompose on the output side
    for ( v = 0; v < nVarsNew; v++ )
    {
        Cof0[v] = Abc_Tt6Cofactor0( t, pVarsNew[v] );
        Cof1[v] = Abc_Tt6Cofactor1( t, pVarsNew[v] );
        assert( Cof0[v] != Cof1[v] );
        if ( Cof0[v] == 0 ) // ax
        {
            pBuffer[Pos++] = '(';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( Cof1[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ')';
            return Pos;
        }
        if ( Cof0[v] == ~(word)0 ) // !(ax)
        {
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = '(';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( ~Cof1[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ')';
            return Pos;
        }
        if ( Cof1[v] == 0 ) // !ax
        {
            pBuffer[Pos++] = '(';
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( Cof0[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ')';
            return Pos;
        }
        if ( Cof1[v] == ~(word)0 ) // !(!ax)
        {
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = '(';
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( ~Cof0[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ')';
            return Pos;
        }
        if ( Cof0[v] == ~Cof1[v] ) // a^x
        {
            pBuffer[Pos++] = '[';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( Cof0[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ']';
            return Pos;
        }
    }
    // decompose on the input side
    for ( v = 0; v < nVarsNew; v++ )
    for ( u = v+1; u < nVarsNew; u++ )
    {
        Cof[0] = Abc_Tt6Cofactor0( Cof0[v], pVarsNew[u] );
        Cof[1] = Abc_Tt6Cofactor1( Cof0[v], pVarsNew[u] );
        Cof[2] = Abc_Tt6Cofactor0( Cof1[v], pVarsNew[u] );
        Cof[3] = Abc_Tt6Cofactor1( Cof1[v], pVarsNew[u] );
        if ( Cof[0] == Cof[1] && Cof[0] == Cof[2] ) // vu
        {
            PosStart = Pos;
            sprintf( pNest, "(%c%c)", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[3]) | (~s_Truths6[pVarsNew[u]] & Cof[0]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
        if ( Cof[0] == Cof[1] && Cof[0] == Cof[3] ) // v!u
        {
            PosStart = Pos;
            sprintf( pNest, "(%c!%c)", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[2]) | (~s_Truths6[pVarsNew[u]] & Cof[0]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
        if ( Cof[0] == Cof[2] && Cof[0] == Cof[3] ) // !vu
        {
            PosStart = Pos;
            sprintf( pNest, "(!%c%c)", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[1]) | (~s_Truths6[pVarsNew[u]] & Cof[0]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
        if ( Cof[1] == Cof[2] && Cof[1] == Cof[3] ) // !v!u
        {
            PosStart = Pos;
            sprintf( pNest, "(!%c!%c)", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[0]) | (~s_Truths6[pVarsNew[u]] & Cof[1]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
        if ( Cof[0] == Cof[3] && Cof[1] == Cof[2] ) // v+u
        {
            PosStart = Pos;
            sprintf( pNest, "[%c%c]", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[1]) | (~s_Truths6[pVarsNew[u]] & Cof[0]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
    } 
    // find best variable for MUX decomposition
    vBest = -1;
    CountBest = 10;
    for ( v = 0; v < nVarsNew; v++ )
    {
        int CountCur = 0;
        for ( u = 0; u < nVarsNew; u++ )
            if ( u != v && Abc_Tt6HasVar(Cof0[v], pVarsNew[u]) && Abc_Tt6HasVar(Cof1[v], pVarsNew[u]) )
                CountCur++;
        if ( CountBest > CountCur )
        {
            CountBest = CountCur;
            vBest = v;
        }
        if ( CountCur == 0 )
            break;
    }
    // perform MUX decomposition
    pBuffer[Pos++] = '<';
    pBuffer[Pos++] = 'a' + pVarsNew[vBest];
    Pos = Dau_DsdPerform_rec( Cof1[vBest], pBuffer, Pos, pVarsNew, nVarsNew );
    Pos = Dau_DsdPerform_rec( Cof0[vBest], pBuffer, Pos, pVarsNew, nVarsNew );
    pBuffer[Pos++] = '>';
    return Pos;
}